

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

int nn_tcp_optset_setopt(nn_optset *self,int option,void *optval,size_t optvallen)

{
  int iVar1;
  
  iVar1 = -0x16;
  if (optvallen == 4) {
    if (option != 1) {
      return -0x5c;
    }
    if (*optval < 2) {
      *(uint *)&self[1].vfptr = *optval;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int nn_tcp_optset_setopt (struct nn_optset *self, int option,
    const void *optval, size_t optvallen)
{
    struct nn_tcp_optset *optset;
    int val;

    optset = nn_cont (self, struct nn_tcp_optset, base);

    /*  At this point we assume that all options are of type int. */
    if (optvallen != sizeof (int))
        return -EINVAL;
    val = *(int*) optval;

    switch (option) {
    case NN_TCP_NODELAY:
        if (nn_slow (val != 0 && val != 1))
            return -EINVAL;
        optset->nodelay = val;
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}